

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Address * ot::commissioner::Address::FromString(Address *__return_storage_ptr__,string *aAddr)

{
  bool bVar1;
  ErrorCode local_58 [4];
  Error local_48;
  undefined1 local_19;
  string *local_18;
  string *aAddr_local;
  Address *ret;
  
  local_19 = 0;
  local_18 = aAddr;
  aAddr_local = (string *)__return_storage_ptr__;
  Address(__return_storage_ptr__);
  Set(&local_48,__return_storage_ptr__,local_18);
  local_58[0] = kNone;
  bVar1 = commissioner::operator==(&local_48,local_58);
  Error::~Error(&local_48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

Address Address::FromString(const std::string &aAddr)
{
    Address ret;

    SuccessOrDie(ret.Set(aAddr));
    return ret;
}